

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

void archive_entry_set_hardlink(archive_entry *entry,char *target)

{
  wchar_t wVar1;
  wchar_t wVar2;
  
  wVar1 = entry->ae_set;
  if (target == (char *)0x0) {
    wVar2 = wVar1 & 0xfffffffe;
    entry->ae_set = wVar2;
    if ((wVar1 & 2U) != 0) {
      return;
    }
  }
  else {
    wVar2 = wVar1 | 1;
  }
  entry->ae_set = wVar2 & 0xfffffffd;
  archive_mstring_copy_mbs(&entry->ae_linkname,target);
  return;
}

Assistant:

void
archive_entry_set_hardlink(struct archive_entry *entry, const char *target)
{
	if (target == NULL) {
		entry->ae_set &= ~AE_SET_HARDLINK;
		if (entry->ae_set & AE_SET_SYMLINK) {
			return;
		}
	} else {
		entry->ae_set |= AE_SET_HARDLINK;
	}
	entry->ae_set &= ~AE_SET_SYMLINK;
	archive_mstring_copy_mbs(&entry->ae_linkname, target);
}